

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>_>
::TestBody(AssignmentOnSelf<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_std::mutex>
  *m_00;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *this_00;
  char *message;
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  AssertionResult gtest_ar;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> local_881;
  allocator_type local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_878;
  undefined1 local_870 [16];
  pointer ppStack_860;
  undefined8 local_858;
  AssertHelper local_850;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_848;
  undefined4 local_830;
  pointer local_828;
  pointer ppStack_820;
  pointer local_818;
  pair<const_phmap::priv::NonStandardLayout,_int> local_810;
  pair<const_phmap::priv::NonStandardLayout,_int> local_7e0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_7b0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_780;
  pair<const_phmap::priv::NonStandardLayout,_int> local_750;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_720;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_810,&local_881);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_7e0,&local_881);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_7b0,&local_881);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_780,&local_881);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_750,&local_881);
  local_870._0_8_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_850.data_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_880.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (AssertHelperData *)
       ((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId->type + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::NonStandardLayout_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_720,&local_810,(pair<const_phmap::priv::NonStandardLayout,_int> *)&local_720,
             0,(hasher *)local_870,(key_equal *)&local_850,&local_880);
  lVar1 = 0x28;
  do {
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *)((long)&local_720.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base.
                         _M_mutex + lVar1);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
    ::operator=(this_00,this_00);
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x728);
  local_830 = 3;
  std::
  vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::vector<std::pair<phmap::priv::NonStandardLayout_const,int>const*,void>
            ((vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&local_828,&local_810,(pair<const_phmap::priv::NonStandardLayout,_int> *)&local_720,
             (allocator_type *)local_870);
  local_848.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_818;
  local_848.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppStack_820;
  local_848.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_828;
  local_870._0_4_ = local_830;
  local_818 = (pointer)0x0;
  local_828 = (pointer)0x0;
  ppStack_820 = (pointer)0x0;
  local_850.data_._0_4_ = local_830;
  local_870._8_8_ = (pointer)0x0;
  ppStack_860 = (pointer)0x0;
  local_858 = 0;
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)(local_870 + 8));
  items<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,std::mutex>>
            ((vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
              *)local_870,(priv *)&local_720,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::operator()(&local_880,(char *)&local_850,
               (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
             *)local_870);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_848);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)&local_828);
  if ((char)local_880.id_ == '\0') {
    testing::Message::Message((Message *)local_870);
    if (local_878 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_878->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1db,message);
    testing::internal::AssertHelper::operator=(&local_850,(Message *)local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_850);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_870._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_870._0_8_ + 8))();
    }
  }
  if (local_878 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_878,local_878);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~parallel_hash_set(&local_720);
  lVar1 = -0xf0;
  paVar2 = &local_750.first.value.field_2;
  do {
    (&paVar2->_M_allocated_capacity)[-3] = (size_type)&PTR__NonStandardLayout_0034b120;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -6);
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}